

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::MainBuilder::Impl::Arg>::truncate
          (ArrayBuilder<kj::MainBuilder::Impl::Arg> *this,char *__file,__off_t __length)

{
  Arg *pAVar1;
  Iface *pIVar2;
  Disposer *pDVar3;
  Arg *pAVar4;
  Arg *pAVar5;
  
  pAVar1 = this->ptr;
  pAVar5 = this->pos;
  while (pAVar4 = pAVar5, pAVar1 + (long)__file < pAVar4) {
    this->pos = pAVar4 + -1;
    pIVar2 = pAVar4[-1].callback.impl.ptr;
    pAVar5 = pAVar4 + -1;
    if (pIVar2 != (Iface *)0x0) {
      pAVar4[-1].callback.impl.ptr = (Iface *)0x0;
      pDVar3 = pAVar4[-1].callback.impl.disposer;
      (**pDVar3->_vptr_Disposer)(pDVar3,pIVar2 + *(long *)(*(long *)pIVar2 + -0x10));
      pAVar5 = this->pos;
    }
  }
  return (int)pAVar4;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }